

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O3

void __thiscall
wabt::ReturnCallIndirectExpr::ReturnCallIndirectExpr(ReturnCallIndirectExpr *this,Location *loc)

{
  size_type sVar1;
  size_t sVar2;
  undefined8 uVar3;
  Location LStack_38;
  
  (this->super_ExprMixin<(wabt::ExprType)39>).super_Expr.super_intrusive_list_base<wabt::Expr>.next_
       = (Expr *)0x0;
  (this->super_ExprMixin<(wabt::ExprType)39>).super_Expr.super_intrusive_list_base<wabt::Expr>.prev_
       = (Expr *)0x0;
  (this->super_ExprMixin<(wabt::ExprType)39>).super_Expr._vptr_Expr =
       (_func_int **)&PTR__Expr_001bbec0;
  sVar1 = (loc->filename).size_;
  sVar2 = (loc->field_1).field_1.offset;
  uVar3 = *(undefined8 *)((long)&loc->field_1 + 8);
  (this->super_ExprMixin<(wabt::ExprType)39>).super_Expr.loc.filename.data_ = (loc->filename).data_;
  (this->super_ExprMixin<(wabt::ExprType)39>).super_Expr.loc.filename.size_ = sVar1;
  (this->super_ExprMixin<(wabt::ExprType)39>).super_Expr.loc.field_1.field_1.offset = sVar2;
  *(undefined8 *)((long)&(this->super_ExprMixin<(wabt::ExprType)39>).super_Expr.loc.field_1 + 8) =
       uVar3;
  (this->super_ExprMixin<(wabt::ExprType)39>).super_Expr.type_ = ReturnCallIndirect;
  (this->super_ExprMixin<(wabt::ExprType)39>).super_Expr._vptr_Expr =
       (_func_int **)&PTR__ReturnCallIndirectExpr_001bc980;
  (this->decl).has_func_type = false;
  LStack_38.field_1.field_0.line = 0;
  LStack_38.field_1._4_8_ = 0;
  LStack_38.filename.data_ = (char *)0x0;
  LStack_38.filename.size_._0_4_ = 0;
  LStack_38.filename.size_._4_4_ = 0;
  Var::Var(&(this->decl).type_var,0xffffffff,&LStack_38);
  (this->decl).sig.result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->decl).sig.result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->decl).sig.param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->decl).sig.result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->decl).sig.param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->decl).sig.param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  LStack_38.field_1.field_0.line = 0;
  LStack_38.field_1._4_8_ = 0;
  LStack_38.filename.data_ = (char *)0x0;
  LStack_38.filename.size_._0_4_ = 0;
  LStack_38.filename.size_._4_4_ = 0;
  Var::Var(&this->table,0xffffffff,&LStack_38);
  return;
}

Assistant:

explicit ReturnCallIndirectExpr(const Location &loc = Location())
      : ExprMixin<ExprType::ReturnCallIndirect>(loc) {}